

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void fits_setup_shape(RgnShape *newShape)

{
  int iVar1;
  anon_union_120_2_131c4ffb_for_param *paVar2;
  uint uVar3;
  shapeType sVar4;
  long lVar5;
  anon_union_120_2_131c4ffb_for_param *paVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  
  sVar4 = newShape->shape;
  if (sVar4 == poly_rgn) {
    paVar6 = (anon_union_120_2_131c4ffb_for_param *)(newShape->param).poly.Pts;
    goto LAB_001efee1;
  }
  paVar6 = &newShape->param;
  switch(sVar4) {
  case line_rgn:
    auVar10._0_8_ = (newShape->param).gen.p[2] - (newShape->param).gen.p[0];
    auVar10._8_8_ = (newShape->param).gen.p[3] - (newShape->param).gen.p[1];
    dVar8 = SQRT(auVar10._0_8_ * auVar10._0_8_ + auVar10._8_8_ * auVar10._8_8_);
    uVar3 = -(uint)(dVar8 != 0.0) & 1;
    auVar15._8_8_ = dVar8;
    auVar15._0_8_ = dVar8;
    auVar10 = divpd(auVar10,auVar15);
    auVar16._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
    auVar16._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
    auVar16._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
    auVar11._0_8_ = auVar10._0_8_ & auVar16._0_8_;
    auVar11._8_8_ = auVar10._8_8_ & auVar16._8_8_;
    auVar17._0_8_ = ~auVar16._0_8_ & 0x3ff0000000000000;
    auVar17._8_8_ = 0;
    auVar17 = auVar17 | auVar11;
    auVar12._0_8_ = auVar17._8_8_;
    auVar12._8_4_ = auVar17._0_4_;
    auVar12._12_4_ = auVar17._4_4_;
    *(undefined1 (*) [16])((long)&newShape->param + 0x58) = auVar12;
    (newShape->param).gen.a = dVar8 + 0.5;
    break;
  case circle_rgn:
    dVar8 = (newShape->param).gen.p[2];
    (newShape->param).gen.a = dVar8 * dVar8;
    break;
  case annulus_rgn:
    dVar8 = (newShape->param).gen.p[2];
    dVar13 = (newShape->param).gen.p[3];
    goto LAB_001efd9d;
  case ellipse_rgn:
  case box_rgn:
  case diamond_rgn:
    dVar8 = sin(((newShape->param).gen.p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar8;
    dVar8 = (newShape->param).gen.p[4];
    goto LAB_001efc71;
  case elliptannulus_rgn:
  case boxannulus_rgn:
    dVar8 = sin(((newShape->param).gen.p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.a = dVar8;
    dVar8 = cos(((newShape->param).gen.p[6] / 180.0) * 3.141592653589793);
    (newShape->param).gen.b = dVar8;
    dVar8 = sin(((newShape->param).gen.p[7] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar8;
    dVar8 = (newShape->param).gen.p[7];
    goto LAB_001efc71;
  case rectangle_rgn:
    dVar8 = sin(((newShape->param).gen.p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar8;
    dVar7 = cos(((newShape->param).gen.p[4] / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar7;
    dVar13 = (newShape->param).gen.p[0];
    dVar9 = (newShape->param).gen.p[1];
    dVar14 = (newShape->param).gen.p[2];
    dVar20 = (newShape->param).gen.p[3];
    dVar18 = (dVar14 - dVar13) * 0.5;
    dVar19 = (dVar20 - dVar9) * 0.5;
    dVar8 = (newShape->param).gen.sinT;
    (newShape->param).gen.a = ABS(dVar7 * dVar18 + dVar19 * dVar8);
    (newShape->param).gen.b = ABS(dVar7 * dVar19 + -dVar18 * dVar8);
    (newShape->param).gen.p[5] = (dVar14 + dVar13) * 0.5;
    (newShape->param).gen.p[6] = (dVar20 + dVar9) * 0.5;
    break;
  case sector_rgn:
    dVar8 = (newShape->param).gen.p[2];
    while (180.0 < dVar8) {
      dVar8 = dVar8 + -360.0;
      (newShape->param).gen.p[2] = dVar8;
    }
    while (dVar8 <= -180.0) {
      dVar8 = dVar8 + 360.0;
      (newShape->param).gen.p[2] = dVar8;
    }
    dVar8 = (newShape->param).gen.p[3];
    while (180.0 < dVar8) {
      dVar8 = dVar8 + -360.0;
      (newShape->param).gen.p[3] = dVar8;
    }
    while (dVar8 <= -180.0) {
      dVar8 = dVar8 + 360.0;
      (newShape->param).gen.p[3] = dVar8;
    }
    break;
  default:
    goto switchD_001efb41_caseD_b;
  case panda_rgn:
    dVar8 = (newShape->param).gen.p[2];
    while (180.0 < dVar8) {
      dVar8 = dVar8 + -360.0;
      (newShape->param).gen.p[2] = dVar8;
    }
    while (dVar8 <= -180.0) {
      dVar8 = dVar8 + 360.0;
      (newShape->param).gen.p[2] = dVar8;
    }
    dVar8 = (newShape->param).gen.p[3];
    while (180.0 < dVar8) {
      dVar8 = dVar8 + -360.0;
      (newShape->param).gen.p[3] = dVar8;
    }
    while (dVar8 <= -180.0) {
      dVar8 = dVar8 + 360.0;
      (newShape->param).gen.p[3] = dVar8;
    }
    dVar8 = (newShape->param).gen.p[5];
    dVar13 = (newShape->param).gen.p[6];
LAB_001efd9d:
    (newShape->param).gen.a = dVar8 * dVar8;
    (newShape->param).gen.b = dVar13 * dVar13;
    break;
  case epanda_rgn:
  case bpanda_rgn:
    dVar8 = (newShape->param).gen.p[2];
    while (180.0 < dVar8) {
      dVar8 = dVar8 + -360.0;
      (newShape->param).gen.p[2] = dVar8;
    }
    while (dVar8 <= -180.0) {
      dVar8 = dVar8 + 360.0;
      (newShape->param).gen.p[2] = dVar8;
    }
    dVar8 = (newShape->param).gen.p[3];
    while (180.0 < dVar8) {
      dVar8 = dVar8 + -360.0;
      (newShape->param).gen.p[3] = dVar8;
    }
    while (dVar8 <= -180.0) {
      dVar8 = dVar8 + 360.0;
      (newShape->param).gen.p[3] = dVar8;
    }
    dVar8 = sin(((newShape->param).gen.p[10] / 180.0) * 3.141592653589793);
    (newShape->param).gen.sinT = dVar8;
    dVar8 = (newShape->param).gen.p[10];
LAB_001efc71:
    dVar8 = cos((dVar8 / 180.0) * 3.141592653589793);
    (newShape->param).gen.cosT = dVar8;
  }
LAB_001efee1:
  sVar4 = newShape->shape;
switchD_001efb41_caseD_b:
  switch(sVar4) {
  case point_rgn:
    dVar8 = 1.0;
    goto LAB_001effd2;
  default:
    goto switchD_001efefd_caseD_1;
  case circle_rgn:
    dVar8 = (paVar6->gen).p[2];
    break;
  case annulus_rgn:
    dVar8 = (paVar6->gen).p[3];
    break;
  case ellipse_rgn:
    dVar8 = (paVar6->gen).p[2];
    if ((paVar6->gen).p[2] <= (paVar6->gen).p[3]) {
      dVar8 = (paVar6->gen).p[3];
    }
    break;
  case elliptannulus_rgn:
    dVar8 = (paVar6->gen).p[4];
    if ((paVar6->gen).p[4] <= (paVar6->gen).p[5]) {
      dVar8 = (paVar6->gen).p[5];
    }
    break;
  case box_rgn:
    dVar8 = (paVar6->gen).p[2] * (paVar6->gen).p[2] + (paVar6->gen).p[3] * (paVar6->gen).p[3];
    goto LAB_001eff7d;
  case boxannulus_rgn:
    dVar8 = (paVar6->gen).p[4] * (paVar6->gen).p[5];
    goto LAB_001eff6f;
  case diamond_rgn:
    dVar8 = (paVar6->gen).p[2];
    if (dVar8 <= (paVar6->gen).p[3]) {
      dVar8 = (paVar6->gen).p[3] * 0.5;
      break;
    }
    goto LAB_001eff9c;
  case panda_rgn:
    dVar8 = (paVar6->gen).p[6];
    break;
  case epanda_rgn:
    dVar8 = (paVar6->gen).p[7];
    if ((paVar6->gen).p[7] <= (paVar6->gen).p[8]) {
      dVar8 = (paVar6->gen).p[8];
    }
    break;
  case bpanda_rgn:
    dVar8 = (paVar6->gen).p[7] * (paVar6->gen).p[8];
LAB_001eff6f:
    dVar8 = dVar8 + dVar8;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
LAB_001eff7d:
      dVar8 = SQRT(dVar8);
    }
LAB_001eff9c:
    dVar8 = dVar8 * 0.5;
  }
  if (dVar8 <= 0.0) {
    sVar4 = newShape->shape;
switchD_001efefd_caseD_1:
    if (sVar4 == line_rgn) {
      dVar8 = (paVar6->gen).p[2];
      paVar2 = paVar6;
      if ((paVar6->gen).p[0] <= dVar8) {
        dVar8 = (paVar6->gen).p[0];
        paVar2 = (anon_union_120_2_131c4ffb_for_param *)((paVar6->gen).p + 2);
      }
      newShape->xmin = dVar8;
      newShape->xmax = (paVar2->gen).p[0];
      if ((paVar6->gen).p[1] <= (paVar6->gen).p[3]) {
        newShape->ymin = (paVar6->gen).p[1];
        dVar8 = (paVar6->gen).p[3];
      }
      else {
        newShape->ymin = (paVar6->gen).p[3];
        dVar8 = (paVar6->gen).p[1];
      }
    }
    else {
      if (sVar4 == poly_rgn) {
        dVar8 = (paVar6->gen).p[0];
        newShape->xmin = dVar8;
        newShape->xmax = dVar8;
        dVar13 = (paVar6->gen).p[1];
        newShape->ymin = dVar13;
        newShape->ymax = dVar13;
        iVar1 = (newShape->param).poly.nPts;
        dVar9 = dVar8;
        dVar14 = dVar13;
        for (lVar5 = 2; lVar5 < iVar1; lVar5 = lVar5 + 2) {
          dVar20 = *(double *)((long)paVar6 + lVar5 * 8);
          if (dVar20 < dVar8) {
            newShape->xmin = dVar20;
            dVar8 = dVar20;
            dVar20 = *(double *)((long)paVar6 + lVar5 * 8);
          }
          if (dVar9 < dVar20) {
            newShape->xmax = dVar20;
            dVar9 = dVar20;
          }
          dVar20 = *(double *)((long)paVar6 + lVar5 * 8 + 8);
          dVar7 = dVar20;
          if (dVar20 < dVar14) {
            newShape->ymin = dVar20;
            dVar7 = *(double *)((long)paVar6 + lVar5 * 8 + 8);
            dVar14 = dVar20;
          }
          if (dVar13 < dVar7) {
            newShape->ymax = dVar7;
            dVar13 = dVar7;
          }
        }
        return;
      }
      if (sVar4 == sector_rgn) {
        newShape->xmin = 1.0;
        newShape->xmax = -1.0;
        newShape->ymin = 1.0;
        dVar8 = -1.0;
      }
      else {
        if (sVar4 != rectangle_rgn) {
          return;
        }
        dVar13 = (paVar6->gen).p[5] - (paVar6->gen).p[0];
        dVar8 = (paVar6->gen).p[6] - (paVar6->gen).p[1];
        dVar8 = SQRT(dVar13 * dVar13 + dVar8 * dVar8);
        newShape->xmin = (paVar6->gen).p[5] - dVar8;
        newShape->xmax = (paVar6->gen).p[5] + dVar8;
        newShape->ymin = (paVar6->gen).p[6] - dVar8;
        dVar8 = dVar8 + (paVar6->gen).p[6];
      }
    }
  }
  else {
LAB_001effd2:
    newShape->xmin = (paVar6->gen).p[0] - dVar8;
    newShape->xmax = (paVar6->gen).p[0] + dVar8;
    newShape->ymin = (paVar6->gen).p[1] - dVar8;
    dVar8 = dVar8 + (paVar6->gen).p[1];
  }
  newShape->ymax = dVar8;
  return;
}

Assistant:

void fits_setup_shape ( RgnShape *newShape)
{
/* Perform some useful calculations now to speed up filter later             */

  double X, Y, R;
  double *coords;
  int i;

  if ( newShape->shape == poly_rgn ) {
    coords = newShape->param.poly.Pts;
  } else {
    coords = newShape->param.gen.p;
  }

  switch( newShape->shape ) {
  case circle_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    break;
  case annulus_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    newShape->param.gen.b = coords[3] * coords[3];
    break;
  case sector_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    break;
  case ellipse_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case elliptannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case box_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case boxannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case rectangle_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    X = 0.5 * ( coords[2]-coords[0] );
    Y = 0.5 * ( coords[3]-coords[1] );
    newShape->param.gen.a = fabs( X * newShape->param.gen.cosT
				  + Y * newShape->param.gen.sinT );
    newShape->param.gen.b = fabs( Y * newShape->param.gen.cosT
				  - X * newShape->param.gen.sinT );
    newShape->param.gen.p[5] = 0.5 * ( coords[2]+coords[0] );
    newShape->param.gen.p[6] = 0.5 * ( coords[3]+coords[1] );
    break;
  case diamond_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case line_rgn:
    X = coords[2] - coords[0];
    Y = coords[3] - coords[1];
    R = sqrt( X*X + Y*Y );
    newShape->param.gen.sinT = ( R ? Y/R : 0.0 );
    newShape->param.gen.cosT = ( R ? X/R : 1.0 );
    newShape->param.gen.a    = R + 0.5;
    break;
  case panda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.a = newShape->param.gen.p[5]*newShape->param.gen.p[5];
    newShape->param.gen.b = newShape->param.gen.p[6]*newShape->param.gen.p[6];
    break;
  case epanda_rgn:
  case bpanda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.sinT = sin( myPI * (coords[10] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[10] / 180.0) );
    break;
  default:
    break;
  }

  /*  Set the xmin, xmax, ymin, ymax elements of the RgnShape structure */

  /* For everything which has first two parameters as center position just */
  /* find a circle that encompasses the region and use it to set the       */
  /* bounding box                                                          */

  R = -1.0;

  switch ( newShape->shape ) {

  case circle_rgn:
    R = coords[2];
    break;

  case annulus_rgn:
    R = coords[3];
    break;

  case ellipse_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2];
    } else {
      R = coords[3];
    }
    break;

  case elliptannulus_rgn:
    if ( coords[4] > coords[5] ) {
      R = coords[4];
    } else {
      R = coords[5];
    }
    break;

  case box_rgn:
    R = sqrt(coords[2]*coords[2]+
	     coords[3]*coords[3])/2.0;
    break;

  case boxannulus_rgn:
    R = sqrt(coords[4]*coords[5]+
	     coords[4]*coords[5])/2.0;
    break;

  case diamond_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2]/2.0;
    } else {
      R = coords[3]/2.0;
    }
    break;
    
  case point_rgn:
    R = 1.0;
    break;

  case panda_rgn:
    R = coords[6];
    break;

  case epanda_rgn:
    if ( coords[7] > coords[8] ) {
      R = coords[7];
    } else {
      R = coords[8];
    }
    break;

  case bpanda_rgn:
    R = sqrt(coords[7]*coords[8]+
	     coords[7]*coords[8])/2.0;
    break;

  default:
    break;
  }

  if ( R > 0.0 ) {

    newShape->xmin = coords[0] - R;
    newShape->xmax = coords[0] + R;
    newShape->ymin = coords[1] - R;
    newShape->ymax = coords[1] + R;

    return;

  }

  /* Now do the rest of the shapes that require individual methods */

  switch ( newShape->shape ) {

  case rectangle_rgn:
    R = sqrt((coords[5]-coords[0])*(coords[5]-coords[0])+
	     (coords[6]-coords[1])*(coords[6]-coords[1]));
    newShape->xmin = coords[5] - R;
    newShape->xmax = coords[5] + R;
    newShape->ymin = coords[6] - R;
    newShape->ymax = coords[6] + R;
    break;

  case poly_rgn:
    newShape->xmin = coords[0];
    newShape->xmax = coords[0];
    newShape->ymin = coords[1];
    newShape->ymax = coords[1];
    for( i=2; i < newShape->param.poly.nPts; ) {
      if( newShape->xmin > coords[i] ) /* Min X */
	newShape->xmin = coords[i];
      if( newShape->xmax < coords[i] ) /* Max X */
	newShape->xmax = coords[i];
      i++;
      if( newShape->ymin > coords[i] ) /* Min Y */
	newShape->ymin = coords[i];
      if( newShape->ymax < coords[i] ) /* Max Y */
	newShape->ymax = coords[i];
      i++;
    }
    break;

  case line_rgn:
    if ( coords[0] > coords[2] ) {
      newShape->xmin = coords[2];
      newShape->xmax = coords[0];
    } else {
      newShape->xmin = coords[0];
      newShape->xmax = coords[2];
    }
    if ( coords[1] > coords[3] ) {
      newShape->ymin = coords[3];
      newShape->ymax = coords[1];
    } else {
      newShape->ymin = coords[1];
      newShape->ymax = coords[3];
    }

    break;

    /* sector doesn't have min and max so indicate by setting max < min */

  case sector_rgn:
    newShape->xmin = 1.0;
    newShape->xmax = -1.0;
    newShape->ymin = 1.0;
    newShape->ymax = -1.0;
    break;

  default:
    break;
  }

  return;

}